

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_animatable_default<std::array<float,2ul>>
          (string *__return_storage_ptr__,tinyusdz *this,Animatable<std::array<float,_2UL>_> *v,
          uint32_t indent)

{
  array<float,_2UL> a;
  stringstream ss;
  allocator local_1a1;
  float2 local_1a0;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  if (this[9] == (tinyusdz)0x1) {
    std::operator<<(local_188,"None");
  }
  if (this[8] == (tinyusdz)0x1) {
    if (this[9] != (tinyusdz)0x0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"[Animatable: InternalError]",&local_1a1);
      goto LAB_001e7287;
    }
    local_1a0._M_elems = *(_Type *)this;
    std::operator<<(local_188,&local_1a0);
  }
  std::__cxx11::stringbuf::str();
LAB_001e7287:
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_default(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  (void)indent;

  std::stringstream ss;

  if (v.is_blocked()) {
    ss << "None";
  }

  if (v.has_value()) {
    T a;
    if (!v.get_scalar(&a)) {
      return "[Animatable: InternalError]";
    }
    ss << a;
  }

  return ss.str();
}